

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hpp
# Opt level: O2

void __thiscall CJSON::AddPair<TestArrObj*>(CJSON *this,string *Name,TestArrObj **val,size_t Size)

{
  iterator iVar1;
  mapped_type *this_00;
  CJSONException *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this,Name);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->m_Values)._M_t._M_impl.super__Rb_tree_header) {
    ArrayToStr<TestArrObj_*,_nullptr>(&local_50,this,val,Size);
    std::operator+(&local_90,'[',&local_50);
    std::operator+(&local_70,&local_90,']');
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->m_Values,Name);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    return;
  }
  this_01 = (CJSONException *)__cxa_allocate_exception(0x30);
  std::operator+(&local_90,"Name \'",Name);
  std::operator+(&local_70,&local_90,"\' already exists!");
  CJSONException::CJSONException(this_01,&local_70,NAME_ALREADY_EXITS);
  __cxa_throw(this_01,&CJSONException::typeinfo,CJSONException::~CJSONException);
}

Assistant:

inline void AddPair(const std::string &Name, const T &val, size_t Size)
        {
            if(m_Values.find(Name) != m_Values.end())
                throw CJSONException("Name '" + Name + "' already exists!", JSONErrorType::NAME_ALREADY_EXITS);         

            m_Values[Name] = '[' + ArrayToStr(val, Size) + ']'; 
        }